

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_type_create_darray_
               (MPIABI_Fint *size,MPIABI_Fint *rank,MPIABI_Fint *ndims,int *array_of_gsizes,
               int *array_of_distribs,int *array_of_dargs,int *array_of_psizes,MPIABI_Fint *order,
               MPIABI_Fint *oldtype,MPIABI_Fint *newtype,MPIABI_Fint *ierror)

{
  mpi_type_create_darray_();
  return;
}

Assistant:

void mpiabi_type_create_darray_(
  const MPIABI_Fint * size,
  const MPIABI_Fint * rank,
  const MPIABI_Fint * ndims,
  const int * array_of_gsizes,
  const int * array_of_distribs,
  const int * array_of_dargs,
  const int * array_of_psizes,
  const MPIABI_Fint * order,
  const MPIABI_Fint * oldtype,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_create_darray_(
    size,
    rank,
    ndims,
    array_of_gsizes,
    array_of_distribs,
    array_of_dargs,
    array_of_psizes,
    order,
    oldtype,
    newtype,
    ierror
  );
}